

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int loop_invariant_p(gen_ctx_t gen_ctx,loop_node_t_conflict loop,bb_insn_t_conflict bb_insn,
                    bitmap_t loop_invariant_insn_bitmap)

{
  char cVar1;
  MIR_insn_t pMVar2;
  long lVar3;
  uint uVar4;
  MIR_insn_t pMVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  loop_node_t plVar9;
  ulong uVar10;
  anon_union_32_12_57d33f68_for_u *paVar11;
  int op_num;
  MIR_op_t *local_68;
  ulong local_60;
  MIR_reg_t var;
  insn_var_iterator_t iter;
  
  pMVar2 = bb_insn->insn;
  iVar7 = 0;
  uVar8 = *(ulong *)&pMVar2->field_0x18;
  uVar4 = (uint)uVar8;
  iVar6 = 0;
  if (((uVar4 - 0xa5 < 0xffffffd1) &&
      ((((0x14 < uVar4 - 0xa6 || ((0x104071U >> (uVar4 - 0xa6 & 0x1f) & 1) == 0)) &&
        (iVar6 = iVar7, uVar4 - 0xaa < 0xfffffffd)) &&
       ((0x3b < uVar4 || ((0xf1e000000000000U >> (uVar8 & 0x3f) & 1) == 0)))))) &&
     (6 < uVar4 - 0xad)) {
    local_68 = pMVar2->ops;
    uVar10 = 0;
    pMVar5 = pMVar2;
    while( true ) {
      paVar11 = &pMVar5->ops[0].u;
      iter.nops = uVar8 >> 0x20;
      if (iter.nops <= uVar10) break;
      cVar1 = pMVar5->ops[0].field_0x8;
      if (cVar1 == '\x02') {
        local_60 = uVar10;
        iVar6 = bitmap_bit_p(gen_ctx->tied_regs,(ulong)paVar11->reg);
        if (iVar6 != 0) {
          return 0;
        }
        uVar8 = *(ulong *)&pMVar2->field_0x18;
        uVar10 = local_60;
      }
      else if (cVar1 == '\v') {
        return 0;
      }
      uVar10 = uVar10 + 1;
      pMVar5 = (MIR_insn_t)paVar11;
    }
    iter.op_num = 0;
    iter.op_part_num = 0;
    iVar6 = 1;
    iter.insn = pMVar2;
    while (iVar7 = input_insn_var_iterator_next(gen_ctx,&iter,&var,&op_num), iVar7 != 0) {
      if (local_68[op_num].data == (void *)0x0) {
        __assert_fail("se != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x14bf,"int loop_invariant_p(gen_ctx_t, loop_node_t, bb_insn_t, bitmap_t)");
      }
      lVar3 = *(long *)((long)local_68[op_num].data + 8);
      if ((loop_invariant_insn_bitmap == (bitmap_t)0x0) ||
         (iVar7 = bitmap_bit_p(loop_invariant_insn_bitmap,(ulong)*(uint *)(lVar3 + 0xc)), iVar7 == 0
         )) {
        plVar9 = loop;
        do {
          plVar9 = plVar9->parent;
          if (plVar9 == (loop_node_t)0x0) {
            return 0;
          }
        } while (plVar9 != *(loop_node_t *)(*(long *)(*(long *)(lVar3 + 0x30) + 0x98) + 0x18));
      }
    }
  }
  return iVar6;
}

Assistant:

static int loop_invariant_p (gen_ctx_t gen_ctx, loop_node_t loop, bb_insn_t bb_insn,
                             bitmap_t loop_invariant_insn_bitmap) {
  MIR_insn_t insn = bb_insn->insn;
  bb_t bb = bb_insn->bb;
  loop_node_t curr_loop;
  int op_num;
  MIR_reg_t var;
  ssa_edge_t se;
  insn_var_iterator_t iter;

  if (MIR_any_branch_code_p (insn->code) || insn->code == MIR_PHI || insn->code == MIR_RET
      || insn->code == MIR_JRET || insn->code == MIR_LABEL || MIR_call_code_p (insn->code)
      || insn->code == MIR_ALLOCA || insn->code == MIR_BSTART || insn->code == MIR_BEND
      || insn->code == MIR_VA_START || insn->code == MIR_VA_ARG || insn->code == MIR_VA_BLOCK_ARG
      || insn->code == MIR_VA_END
      /* possible exception insns: */
      || insn->code == MIR_DIV || insn->code == MIR_DIVS || insn->code == MIR_UDIV
      || insn->code == MIR_UDIVS || insn->code == MIR_MOD || insn->code == MIR_MODS
      || insn->code == MIR_UMOD || insn->code == MIR_UMODS)
    return FALSE;
  for (size_t i = 0; i < insn->nops; i++) {
    if (insn->ops[i].mode == MIR_OP_VAR_MEM) return FALSE;
    if (insn->ops[i].mode == MIR_OP_VAR && bitmap_bit_p (tied_regs, insn->ops[i].u.var))
      return FALSE;
  }
  FOREACH_IN_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
    se = insn->ops[op_num].data;
    gen_assert (se != NULL);
    bb_insn = se->def;
    if (loop_invariant_insn_bitmap != NULL
        && bitmap_bit_p (loop_invariant_insn_bitmap, bb_insn->index))
      continue;
    bb = bb_insn->bb;
    for (curr_loop = loop->parent; curr_loop != NULL; curr_loop = curr_loop->parent)
      if (curr_loop == bb->loop_node->parent) break;
    if (curr_loop == NULL) return FALSE;
  }
  return TRUE;
}